

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void secp256k1_memczero(void *s,size_t len,int flag)

{
  size_t sVar1;
  int vflag;
  
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    *(byte *)((long)s + sVar1) = *(byte *)((long)s + sVar1) & (char)flag - 1U;
  }
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_memczero(void *s, size_t len, int flag) {
    unsigned char *p = (unsigned char *)s;
    /* Access flag with a volatile-qualified lvalue.
       This prevents clang from figuring out (after inlining) that flag can
       take only be 0 or 1, which leads to variable time code. */
    volatile int vflag = flag;
    unsigned char mask = -(unsigned char) vflag;
    while (len) {
        *p &= ~mask;
        p++;
        len--;
    }
}